

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

void Ssw_SmlSimulateOneDyn_rec(Ssw_Sml_t *p,Aig_Obj_t *pObj,int f,int *pVisited,int nVisCounter)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int nVisCounter_local;
  int *pVisited_local;
  int f_local;
  Aig_Obj_t *pObj_local;
  Ssw_Sml_t *p_local;
  
  if (pVisited[p->nFrames * pObj->Id + f] != nVisCounter) {
    pVisited[p->nFrames * pObj->Id + f] = nVisCounter;
    iVar1 = Saig_ObjIsPi(p->pAig,pObj);
    if ((iVar1 == 0) && (iVar1 = Aig_ObjIsConst1(pObj), iVar1 == 0)) {
      iVar1 = Saig_ObjIsLo(p->pAig,pObj);
      if (iVar1 == 0) {
        iVar1 = Saig_ObjIsLi(p->pAig,pObj);
        if (iVar1 == 0) {
          iVar1 = Aig_ObjIsNode(pObj);
          if (iVar1 == 0) {
            __assert_fail("Aig_ObjIsNode(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                          ,0x44c,
                          "void Ssw_SmlSimulateOneDyn_rec(Ssw_Sml_t *, Aig_Obj_t *, int, int *, int)"
                         );
          }
          pAVar2 = Aig_ObjFanin0(pObj);
          Ssw_SmlSimulateOneDyn_rec(p,pAVar2,f,pVisited,nVisCounter);
          pAVar2 = Aig_ObjFanin1(pObj);
          Ssw_SmlSimulateOneDyn_rec(p,pAVar2,f,pVisited,nVisCounter);
          Ssw_SmlNodeSimulate(p,pObj,f);
        }
        else {
          pAVar2 = Aig_ObjFanin0(pObj);
          Ssw_SmlSimulateOneDyn_rec(p,pAVar2,f,pVisited,nVisCounter);
          Ssw_SmlNodeCopyFanin(p,pObj,f);
        }
      }
      else if (f != 0) {
        pAVar2 = Saig_ObjLoToLi(p->pAig,pObj);
        Ssw_SmlSimulateOneDyn_rec(p,pAVar2,f + -1,pVisited,nVisCounter);
        pAVar2 = Saig_ObjLoToLi(p->pAig,pObj);
        Ssw_SmlNodeTransferNext(p,pAVar2,pObj,f + -1);
      }
    }
  }
  return;
}

Assistant:

void Ssw_SmlSimulateOneDyn_rec( Ssw_Sml_t * p, Aig_Obj_t * pObj, int f, int * pVisited, int nVisCounter )
{
//    if ( Aig_ObjIsTravIdCurrent(p->pAig, pObj) )
//        return;
//    Aig_ObjSetTravIdCurrent(p->pAig, pObj);
    if ( pVisited[p->nFrames*pObj->Id+f] == nVisCounter )
        return;
    pVisited[p->nFrames*pObj->Id+f] = nVisCounter;
    if ( Saig_ObjIsPi( p->pAig, pObj ) || Aig_ObjIsConst1(pObj) )
        return;
    if ( Saig_ObjIsLo( p->pAig, pObj ) )
    {
        if ( f == 0 )
            return;
        Ssw_SmlSimulateOneDyn_rec( p, Saig_ObjLoToLi(p->pAig, pObj), f-1, pVisited, nVisCounter );
        Ssw_SmlNodeTransferNext( p, Saig_ObjLoToLi(p->pAig, pObj), pObj, f-1 );
        return;
    }
    if ( Saig_ObjIsLi( p->pAig, pObj ) )
    {
        Ssw_SmlSimulateOneDyn_rec( p, Aig_ObjFanin0(pObj), f, pVisited, nVisCounter );
        Ssw_SmlNodeCopyFanin( p, pObj, f );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    Ssw_SmlSimulateOneDyn_rec( p, Aig_ObjFanin0(pObj), f, pVisited, nVisCounter );
    Ssw_SmlSimulateOneDyn_rec( p, Aig_ObjFanin1(pObj), f, pVisited, nVisCounter );
    Ssw_SmlNodeSimulate( p, pObj, f );
}